

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O2

void __thiscall google::protobuf::MapKey::CopyFrom(MapKey *this,MapKey *other)

{
  CppType type;
  LogMessage *other_00;
  LogFinisher local_49;
  LogMessage local_48;
  
  type = MapKey::type(other);
  SetType(this,type);
  switch(this->type_) {
  case 1:
  case 3:
    (this->val_).int32_value_ = (other->val_).int32_value_;
    break;
  case 2:
  case 4:
    this->val_ = other->val_;
    break;
  case 5:
  case 6:
  case 8:
  case 10:
    internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/map_field.h"
               ,0x1fe);
    other_00 = internal::LogMessage::operator<<(&local_48,"Unsupported");
    internal::LogFinisher::operator=(&local_49,other_00);
    internal::LogMessage::~LogMessage(&local_48);
    break;
  case 7:
    (this->val_).bool_value_ = (other->val_).bool_value_;
    break;
  case 9:
    std::__cxx11::string::_M_assign((string *)(this->val_).string_value_);
    return;
  }
  return;
}

Assistant:

void CopyFrom(const MapKey& other) {
    SetType(other.type());
    switch (type_) {
      case FieldDescriptor::CPPTYPE_DOUBLE:
      case FieldDescriptor::CPPTYPE_FLOAT:
      case FieldDescriptor::CPPTYPE_ENUM:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Unsupported";
        break;
      case FieldDescriptor::CPPTYPE_STRING:
        *val_.string_value_ = *other.val_.string_value_;
        break;
      case FieldDescriptor::CPPTYPE_INT64:
        val_.int64_value_ = other.val_.int64_value_;
        break;
      case FieldDescriptor::CPPTYPE_INT32:
        val_.int32_value_ = other.val_.int32_value_;
        break;
      case FieldDescriptor::CPPTYPE_UINT64:
        val_.uint64_value_ = other.val_.uint64_value_;
        break;
      case FieldDescriptor::CPPTYPE_UINT32:
        val_.uint32_value_ = other.val_.uint32_value_;
        break;
      case FieldDescriptor::CPPTYPE_BOOL:
        val_.bool_value_ = other.val_.bool_value_;
        break;
    }
  }